

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

void __thiscall
Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::expand
          (Set<Kernel::Literal_*,_Lib::DefaultHash> *this)

{
  int iVar1;
  Set<Kernel::Literal_*,_Lib::DefaultHash> *array;
  bool bVar2;
  int iVar3;
  Cell *pCVar4;
  int *in_RDI;
  undefined1 auVar5 [16];
  int remaining;
  Cell *current;
  size_t oldCapacity;
  void *mem;
  Cell *oldEntries;
  size_t newCapacity;
  int local_44;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  Set<Kernel::Literal_*,_Lib::DefaultHash> *this_00;
  
  if (*in_RDI == 0) {
    local_44 = 0x1f;
  }
  else {
    local_44 = *in_RDI << 1;
  }
  array = *(Set<Kernel::Literal_*,_Lib::DefaultHash> **)(in_RDI + 4);
  Lib::alloc((size_t)in_RDI);
  pCVar4 = array_new<Lib::Set<Kernel::Literal*,Lib::DefaultHash>::Cell>
                     (in_stack_ffffffffffffffd0,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  *(Cell **)(in_RDI + 4) = pCVar4;
  *(long *)(in_RDI + 6) = *(long *)(in_RDI + 4) + (long)local_44 * 0x10;
  auVar5._8_4_ = local_44 >> 0x1f;
  auVar5._0_8_ = (long)local_44;
  auVar5._12_4_ = 0x45300000;
  in_RDI[8] = (int)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,local_44) - 4503599627370496.0)) * 0.8);
  iVar1 = *in_RDI;
  *in_RDI = local_44;
  iVar3 = in_RDI[2];
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  this_00 = array;
  for (; iVar3 != 0; iVar3 = iVar3 + -1) {
    while (bVar2 = Cell::occupied((Cell *)this_00), ((bVar2 ^ 0xffU) & 1) != 0) {
      this_00 = (Set<Kernel::Literal_*,_Lib::DefaultHash> *)&this_00->_entries;
    }
    insert(this_00,(Literal *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
           (uint)((ulong)in_RDI >> 0x20));
    this_00 = (Set<Kernel::Literal_*,_Lib::DefaultHash> *)&this_00->_entries;
  }
  if (array != (Set<Kernel::Literal_*,_Lib::DefaultHash> *)0x0) {
    array_delete<Lib::Set<Kernel::Literal*,Lib::DefaultHash>::Cell>((Cell *)array,(long)iVar1);
    Lib::free(array);
  }
  return;
}

Assistant:

void expand()
  {
    size_t newCapacity = _capacity ? _capacity * 2 : 31;
    Cell* oldEntries = _entries;

    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Cell),"Set::Cell");

    _entries = array_new<Cell>(mem, newCapacity);
    _afterLast = _entries + newCapacity;
    _maxEntries = (int)(newCapacity * 0.8);
    size_t oldCapacity = _capacity;
    _capacity = newCapacity;

    // experiments using (a) random numbers (b) consecutive numbers
    // and 30,000,000 allocations
    // 0.6 :  8.49 7.55
    // 0.7 :  9.19 7.71
    // 0.8 :  9.10 8.44
    // 0.9 :  9.34 7.36 (fewer allocations (21 vs. 22), fewer cache faults)
    // 0.95: 10.21 7.48
    // copy old entries
    Cell* current = oldEntries;
    int remaining = _size;
    _nonemptyCells = 0;
    _size = 0;
    while (remaining != 0) {
      // find first occupied cell
      while (! current->occupied()) {
	current++;
      }
      // now current is occupied
      insert(current->value,current->code);
      current ++;
      remaining --;
    }

    if (oldEntries) {
      array_delete(oldEntries,oldCapacity);
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Cell),"Set::Cell");
    }
  }